

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::assignmentOperator(Thread *this,Operator op)

{
  EvaluateValueResult EVar1;
  reference pvVar2;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *pvVar3;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  reference local_60;
  int local_54;
  element_type *local_50;
  int local_44;
  element_type *local_40;
  unsigned_long *local_38;
  unsigned_long *nodePhase;
  Node *node;
  value_type *f;
  Thread *pTStack_18;
  Operator op_local;
  Thread *this_local;
  
  f._7_1_ = op;
  pTStack_18 = this;
  node = (Node *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  pvVar2 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back(&((reference)node)->stack);
  nodePhase = (unsigned_long *)pvVar2->first;
  pvVar2 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   *)&node->annotations);
  local_38 = &pvVar2->second;
  switch(*local_38) {
  case 0:
    *local_38 = *local_38 + 1;
    pvVar3 = &node->annotations;
    p_Var4 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),0)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_40 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
    local_44 = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar3,&local_40,&local_44);
    this_local._7_1_ = true;
    break;
  case 1:
    *local_38 = *local_38 + 1;
    Frame::duplicateTop((Frame *)node);
  case 2:
    EVar1 = evaluateValue(this,Value);
    if (EVar1 == Suspend) {
      this_local._7_1_ = false;
    }
    else if (EVar1 == StackChanged) {
      this_local._7_1_ = true;
    }
    else {
switchD_0020ccfa_caseD_3:
      *local_38 = *local_38 + 1;
      pvVar3 = &node->annotations;
      p_Var4 = &std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)(nodePhase + 0xc),1)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
      local_50 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
      local_54 = 0;
      std::
      vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
      ::emplace_back<chatra::Node*,int>
                ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                  *)pvVar3,&local_50,&local_54);
      this_local._7_1_ = true;
    }
    break;
  case 3:
    goto switchD_0020ccfa_caseD_3;
  case 4:
    EVar1 = evaluateValue(this,Value);
    if (EVar1 == Suspend) {
      return false;
    }
    if (EVar1 == StackChanged) {
      return true;
    }
  case 5:
    *local_38 = 6;
    pvVar3 = &node->annotations;
    local_60 = std::array<chatra::Node,_70UL>::operator[]
                         ((array<chatra::Node,_70UL> *)operatorNode,(ulong)f._7_1_);
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,unsigned_long_const&>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar3,&local_60,&binaryOperatorProcessPhase);
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = assignmentOperator(this);
  }
  return this_local._7_1_;
}

Assistant:

bool Thread::assignmentOperator(Operator op) {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.duplicateTop();  CHATRA_FALLTHROUGH;
	case 2:  CHATRA_EVALUATE_VALUE;
	case 3:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case 4:  CHATRA_EVALUATE_VALUE;
	case 5: {
		nodePhase = assignmentOperatorProcessPhase;
		f.stack.emplace_back(&operatorNode[static_cast<size_t>(op)], binaryOperatorProcessPhase);
		return true;
	}
	default:
		return assignmentOperator();
	}
}